

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WFXMLScanner.cpp
# Opt level: O1

void __thiscall xercesc_4_0::WFXMLScanner::commonInit(WFXMLScanner *this)

{
  MemoryManager *pMVar1;
  XMLSize_t XVar2;
  int iVar3;
  XMLSize_t index;
  ValueHashTableOf<char16_t,_xercesc_4_0::StringHasher> *pVVar4;
  undefined4 extraout_var;
  ValueVectorOf<unsigned_long> *pVVar5;
  undefined4 extraout_var_00;
  ValueVectorOf<xercesc_4_0::XMLAttr_*> *pVVar6;
  undefined4 extraout_var_01;
  RefVectorOf<xercesc_4_0::XMLElementDecl> *pRVar7;
  undefined4 extraout_var_02;
  long lVar8;
  RefHashTableOf<xercesc_4_0::XMLElementDecl,_xercesc_4_0::StringHasher> *pRVar9;
  undefined4 extraout_var_03;
  XMLSize_t XVar10;
  
  pVVar4 = (ValueHashTableOf<char16_t,_xercesc_4_0::StringHasher> *)
           XMemory::operator_new(0x30,(this->super_XMLScanner).fMemoryManager);
  pMVar1 = (this->super_XMLScanner).fMemoryManager;
  pVVar4->fMemoryManager = pMVar1;
  pVVar4->fBucketList = (ValueHashTableBucketElem<char16_t> **)0x0;
  pVVar4->fHashModulus = 0xb;
  pVVar4->fInitialModulus = 0xb;
  pVVar4->fCount = 0;
  iVar3 = (*pMVar1->_vptr_MemoryManager[3])();
  pVVar4->fBucketList = (ValueHashTableBucketElem<char16_t> **)CONCAT44(extraout_var,iVar3);
  memset((ValueHashTableBucketElem<char16_t> **)CONCAT44(extraout_var,iVar3),0,
         pVVar4->fHashModulus << 3);
  this->fEntityTable = pVVar4;
  pVVar5 = (ValueVectorOf<unsigned_long> *)
           XMemory::operator_new(0x28,(this->super_XMLScanner).fMemoryManager);
  pMVar1 = (this->super_XMLScanner).fMemoryManager;
  pVVar5->fCallDestructor = false;
  pVVar5->fCurCount = 0;
  pVVar5->fMaxCount = 0x10;
  pVVar5->fElemList = (unsigned_long *)0x0;
  pVVar5->fMemoryManager = pMVar1;
  iVar3 = (*pMVar1->_vptr_MemoryManager[3])();
  pVVar5->fElemList = (unsigned_long *)CONCAT44(extraout_var_00,iVar3);
  memset((unsigned_long *)CONCAT44(extraout_var_00,iVar3),0,pVVar5->fMaxCount << 3);
  this->fAttrNameHashList = pVVar5;
  pVVar6 = (ValueVectorOf<xercesc_4_0::XMLAttr_*> *)
           XMemory::operator_new(0x28,(this->super_XMLScanner).fMemoryManager);
  pMVar1 = (this->super_XMLScanner).fMemoryManager;
  pVVar6->fCallDestructor = false;
  pVVar6->fCurCount = 0;
  pVVar6->fMaxCount = 8;
  pVVar6->fElemList = (XMLAttr **)0x0;
  pVVar6->fMemoryManager = pMVar1;
  iVar3 = (*pMVar1->_vptr_MemoryManager[3])();
  pVVar6->fElemList = (XMLAttr **)CONCAT44(extraout_var_01,iVar3);
  memset((XMLAttr **)CONCAT44(extraout_var_01,iVar3),0,pVVar6->fMaxCount << 3);
  this->fAttrNSList = pVVar6;
  pRVar7 = (RefVectorOf<xercesc_4_0::XMLElementDecl> *)
           XMemory::operator_new(0x30,(this->super_XMLScanner).fMemoryManager);
  pMVar1 = (this->super_XMLScanner).fMemoryManager;
  (pRVar7->super_BaseRefVectorOf<xercesc_4_0::XMLElementDecl>)._vptr_BaseRefVectorOf =
       (_func_int **)&PTR__BaseRefVectorOf_00415998;
  (pRVar7->super_BaseRefVectorOf<xercesc_4_0::XMLElementDecl>).fAdoptedElems = true;
  (pRVar7->super_BaseRefVectorOf<xercesc_4_0::XMLElementDecl>).fCurCount = 0;
  (pRVar7->super_BaseRefVectorOf<xercesc_4_0::XMLElementDecl>).fMaxCount = 0x20;
  (pRVar7->super_BaseRefVectorOf<xercesc_4_0::XMLElementDecl>).fElemList = (XMLElementDecl **)0x0;
  (pRVar7->super_BaseRefVectorOf<xercesc_4_0::XMLElementDecl>).fMemoryManager = pMVar1;
  iVar3 = (*pMVar1->_vptr_MemoryManager[3])(pMVar1,0x100);
  (pRVar7->super_BaseRefVectorOf<xercesc_4_0::XMLElementDecl>).fElemList =
       (XMLElementDecl **)CONCAT44(extraout_var_02,iVar3);
  lVar8 = 0;
  do {
    (pRVar7->super_BaseRefVectorOf<xercesc_4_0::XMLElementDecl>).fElemList[lVar8] =
         (XMLElementDecl *)0x0;
    lVar8 = lVar8 + 1;
  } while (lVar8 != 0x20);
  (pRVar7->super_BaseRefVectorOf<xercesc_4_0::XMLElementDecl>)._vptr_BaseRefVectorOf =
       (_func_int **)&PTR__RefVectorOf_00415920;
  this->fElements = pRVar7;
  pRVar9 = (RefHashTableOf<xercesc_4_0::XMLElementDecl,_xercesc_4_0::StringHasher> *)
           XMemory::operator_new(0x38,(this->super_XMLScanner).fMemoryManager);
  pMVar1 = (this->super_XMLScanner).fMemoryManager;
  pRVar9->fMemoryManager = pMVar1;
  pRVar9->fAdoptedElems = false;
  pRVar9->fBucketList = (RefHashTableBucketElem<xercesc_4_0::XMLElementDecl> **)0x0;
  pRVar9->fHashModulus = 0x6d;
  pRVar9->fInitialModulus = 0x6d;
  pRVar9->fCount = 0;
  iVar3 = (*pMVar1->_vptr_MemoryManager[3])(pMVar1,0x368);
  pRVar9->fBucketList =
       (RefHashTableBucketElem<xercesc_4_0::XMLElementDecl> **)CONCAT44(extraout_var_03,iVar3);
  XVar2 = pRVar9->fHashModulus;
  if (XVar2 != 0) {
    XVar10 = 0;
    do {
      pRVar9->fBucketList[XVar10] = (RefHashTableBucketElem<xercesc_4_0::XMLElementDecl> *)0x0;
      XVar10 = XVar10 + 1;
    } while (XVar2 != XVar10);
  }
  this->fElementLookup = pRVar9;
  ValueHashTableOf<char16_t,_xercesc_4_0::StringHasher>::put
            (this->fEntityTable,&XMLUni::fgAmp,L"&<>\"\'[>");
  ValueHashTableOf<char16_t,_xercesc_4_0::StringHasher>::put
            (this->fEntityTable,&XMLUni::fgLT,L"<>\"\'[>");
  ValueHashTableOf<char16_t,_xercesc_4_0::StringHasher>::put
            (this->fEntityTable,&XMLUni::fgGT,L">\"\'[>");
  ValueHashTableOf<char16_t,_xercesc_4_0::StringHasher>::put
            (this->fEntityTable,XMLUni::fgQuot,L"\"\'[>");
  ValueHashTableOf<char16_t,_xercesc_4_0::StringHasher>::put
            (this->fEntityTable,XMLUni::fgApos,L"\'[>");
  return;
}

Assistant:

void WFXMLScanner::commonInit()
{
    fEntityTable = new (fMemoryManager) ValueHashTableOf<XMLCh>(11, fMemoryManager);
    fAttrNameHashList = new (fMemoryManager)ValueVectorOf<XMLSize_t>(16, fMemoryManager);
    fAttrNSList = new (fMemoryManager) ValueVectorOf<XMLAttr*>(8, fMemoryManager);
    fElements = new (fMemoryManager) RefVectorOf<XMLElementDecl>(32, true, fMemoryManager);
    fElementLookup = new (fMemoryManager) RefHashTableOf<XMLElementDecl>(109, false, fMemoryManager);

    //  Add the default entity entries for the character refs that must always
    //  be present.
    fEntityTable->put((void*) XMLUni::fgAmp, chAmpersand);
    fEntityTable->put((void*) XMLUni::fgLT, chOpenAngle);
    fEntityTable->put((void*) XMLUni::fgGT, chCloseAngle);
    fEntityTable->put((void*) XMLUni::fgQuot, chDoubleQuote);
    fEntityTable->put((void*) XMLUni::fgApos, chSingleQuote);
}